

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void NULLCVector::VectorPushBack(NULLCRef val,vector *vec)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char **__src;
  NULLCArray NVar5;
  
  uVar4 = val.typeID;
  uVar1 = vec->elemType;
  if (vec->flags != 0) {
    uVar1 = nullcGetSubType(0);
  }
  if (uVar4 != uVar1) {
    pcVar2 = nullcGetTypeName(uVar4);
    pcVar3 = nullcGetTypeName(vec->elemType);
    nullcThrowError("vector::push_back received value (%s) that is different from vector type (%s)",
                    pcVar2,pcVar3);
    return;
  }
  uVar1 = vec->size;
  if (uVar1 == (vec->data).len) {
    uVar4 = 0x20;
    if (0x1f < uVar1) {
      uVar4 = uVar1 * 3;
    }
    NVar5 = nullcAllocateArrayTyped((vec->data).typeID,uVar4);
    pcVar2 = NVar5.ptr;
    if (pcVar2 == (char *)0x0) {
      return;
    }
    uVar1 = (vec->data).len;
    if (uVar1 != 0) {
      memcpy(pcVar2,(vec->data).ptr,(ulong)(uVar1 * vec->elemSize));
    }
    (vec->data).ptr = NVar5.ptr;
    (vec->data).len = NVar5.len;
    uVar1 = vec->size;
  }
  else {
    pcVar2 = (vec->data).ptr;
  }
  __src = (char **)val.ptr;
  if (vec->flags != 0) {
    __src = &val.ptr;
  }
  memcpy(pcVar2 + vec->elemSize * uVar1,__src,(ulong)vec->elemSize);
  vec->size = vec->size + 1;
  return;
}

Assistant:

void VectorPushBack(NULLCRef val, vector* vec)
	{
		// Check that we received type that is equal to array element type
		if(val.typeID != (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType))
		{
			nullcThrowError("vector::push_back received value (%s) that is different from vector type (%s)", nullcGetTypeName(val.typeID), nullcGetTypeName(vec->elemType));
			return;
		}
		// If not enough space
		if(vec->size == vec->data.len)
		{
			// Allocate new
			unsigned int newSize = 32 > vec->data.len ? 32 : (vec->data.len << 1) + vec->data.len;

			NULLCArray newData = nullcAllocateArrayTyped(vec->data.typeID, newSize);

			if(!newData.ptr)
				return;

			if(vec->data.len)
				memcpy(newData.ptr, vec->data.ptr, unsigned(vec->elemSize * vec->data.len));

			vec->data.ptr = newData.ptr;
			vec->data.len = newData.len;
		}
		memcpy(vec->data.ptr + vec->elemSize * vec->size, vec->flags ? (char*)&val.ptr : val.ptr, vec->elemSize);
		vec->size++;
	}